

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s.c
# Opt level: O3

void Hacl_Hash_Blake2s_finish(uint32_t nn,uint8_t *output,uint32_t *hash)

{
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_28 = *(undefined8 *)hash;
  uStack_20 = *(undefined8 *)(hash + 2);
  local_18 = *(undefined8 *)(hash + 4);
  uStack_10 = *(undefined8 *)(hash + 6);
  memcpy(output,&local_28,(ulong)nn);
  Lib_Memzero0_memzero0(&local_28,0x20);
  return;
}

Assistant:

void Hacl_Hash_Blake2s_finish(uint32_t nn, uint8_t *output, uint32_t *hash)
{
  uint8_t b[32U] = { 0U };
  uint8_t *first = b;
  uint8_t *second = b + 16U;
  uint32_t *row0 = hash;
  uint32_t *row1 = hash + 4U;
  KRML_MAYBE_FOR4(i, 0U, 4U, 1U, store32_le(first + i * 4U, row0[i]););
  KRML_MAYBE_FOR4(i, 0U, 4U, 1U, store32_le(second + i * 4U, row1[i]););
  uint8_t *final = b;
  memcpy(output, final, nn * sizeof (uint8_t));
  Lib_Memzero0_memzero(b, 32U, uint8_t, void *);
}